

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O3

void fs_prepare_cb(uv_prepare_t *handle)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_work_t *req;
  uv_work_t *req_00;
  uv_fs_t *puVar3;
  int64_t eval_b;
  int64_t eval_a;
  uv_metrics_t metrics;
  undefined1 auStack_b8 [16];
  void *local_90;
  uv_metrics_t local_88;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_metrics_info(puVar2,&local_88);
  local_90 = (void *)(long)iVar1;
  if (local_90 != (void *)0x0) {
    puVar3 = (uv_fs_t *)&stack0xffffffffffffff70;
    fs_prepare_cb_cold_1();
    auStack_b8._8_8_ = handle;
    req = (uv_work_t *)malloc(0x80);
    req_00 = (uv_work_t *)malloc(0x80);
    pool_events_counter = pool_events_counter + 1;
    uv_fs_req_cleanup(puVar3);
    puVar2 = uv_default_loop();
    iVar1 = uv_queue_work(puVar2,req,fs_work_cb,fs_after_work_cb);
    auStack_b8._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_b8._0_8_ == (void *)0x0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_queue_work(puVar2,req_00,fs_work_cb,fs_after_work_cb);
      auStack_b8._0_8_ = SEXT48(iVar1);
      if ((void *)auStack_b8._0_8_ == (void *)0x0) {
        return;
      }
    }
    else {
      fs_write_cb_cold_1();
    }
    puVar3 = (uv_fs_t *)auStack_b8;
    fs_write_cb_cold_2();
    uv_fs_req_cleanup(puVar3);
    pool_events_counter = pool_events_counter + 1;
    return;
  }
  local_90 = (void *)0x0;
  iVar1 = pool_events_counter;
  if (pool_events_counter == 1) {
    local_90 = (void *)local_88.events;
    if (local_88.events == local_88.events_waiting) {
      return;
    }
    fs_prepare_cb_cold_2();
    iVar1 = extraout_EAX;
  }
  if (6 < iVar1) {
    uv_prepare_stop(handle);
    pool_events_counter = -0x2a;
  }
  return;
}

Assistant:

static void fs_prepare_cb(uv_prepare_t* handle) {
  uv_metrics_t metrics;

  ASSERT_OK(uv_metrics_info(uv_default_loop(), &metrics));

  if (pool_events_counter == 1)
    ASSERT_EQ(metrics.events, metrics.events_waiting);

  if (pool_events_counter < 7)
    return;

  uv_prepare_stop(handle);
  pool_events_counter = -42;
}